

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::LengthPropagateStats(ClientContext *context,FunctionStatisticsInput *input)

{
  bool bVar1;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_RDX;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RSI;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> in_RDI;
  BoundFunctionExpression *expr;
  vector<duckdb::BaseStatistics,_true> *child_stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> this;
  
  this._M_head_impl = in_RDI._M_head_impl;
  vector<duckdb::BaseStatistics,_true>::operator[]
            ((vector<duckdb::BaseStatistics,_true> *)in_RDI._M_head_impl,
             (size_type)in_RDI._M_head_impl);
  bVar1 = StringStats::CanContainUnicode(in_RDI._M_head_impl);
  if (!bVar1) {
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              (in_RSI,in_RDX);
  }
  unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
  unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)this._M_head_impl,in_RDI._M_head_impl);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         this._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> LengthPropagateStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 1);
	// can only propagate stats if the children have stats
	if (!StringStats::CanContainUnicode(child_stats[0])) {
		expr.function.function = ScalarFunction::UnaryFunction<string_t, int64_t, StrLenOperator>;
	}
	return nullptr;
}